

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O0

sexp sexp_bignum_mul(sexp ctx,sexp dst,sexp a,sexp b)

{
  undefined8 b_00;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  sexp_gc_var_t __sexp_gc_preserver7;
  sexp z2;
  sexp_gc_var_t __sexp_gc_preserver6;
  sexp z1;
  sexp_gc_var_t __sexp_gc_preserver5;
  sexp z0;
  sexp_gc_var_t __sexp_gc_preserver4;
  sexp b1;
  sexp_gc_var_t __sexp_gc_preserver3;
  sexp b0;
  sexp_gc_var_t __sexp_gc_preserver2;
  sexp a1;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp a0;
  sexp_uint_t *bdata;
  sexp_uint_t k;
  sexp_uint_t blen;
  sexp_uint_t alen;
  undefined1 *local_f0;
  sexp b_01;
  sexp psVar1;
  sexp dst_00;
  sexp ctx_00;
  sexp_conflict *lo;
  undefined8 ctx_01;
  undefined8 local_a8;
  undefined8 in_stack_ffffffffffffff60;
  undefined4 offset;
  undefined8 uVar2;
  undefined8 in_stack_ffffffffffffff70;
  undefined8 in_stack_ffffffffffffff78;
  undefined8 uVar3;
  undefined8 local_78 [2];
  undefined1 local_68 [56];
  undefined8 local_8;
  
  offset = (undefined4)((ulong)in_stack_ffffffffffffff60 >> 0x20);
  b_00 = sexp_bignum_hi((sexp)in_RDX);
  local_68._48_8_ = sexp_bignum_hi((sexp)in_RCX);
  local_68._32_8_ = in_RCX + 0x18;
  local_68._24_8_ = &DAT_0000043e;
  memset(local_68 + 8,0,0x10);
  local_68._0_8_ = &DAT_0000043e;
  memset(local_78,0,0x10);
  uVar3 = &DAT_0000043e;
  memset(&stack0xffffffffffffff70,0,0x10);
  uVar2 = &DAT_0000043e;
  memset(&stack0xffffffffffffff58,0,0x10);
  ctx_01 = &DAT_0000043e;
  memset(&stack0xffffffffffffff40,0,0x10);
  lo = (sexp_conflict *)&DAT_0000043e;
  memset(&stack0xffffffffffffff28,0,0x10);
  psVar1 = (sexp)&DAT_0000043e;
  memset(&local_f0,0,0x10);
  if ((ulong)b_00 < (ulong)local_68._48_8_) {
    local_8 = sexp_bignum_mul((sexp)in_RSI,(sexp)in_RDX,(sexp)in_RCX,(sexp)b_00);
  }
  else {
    if ((sexp)local_68._48_8_ == (sexp)&DAT_00000001) {
      local_8 = sexp_bignum_fxmul((sexp)uVar3,(sexp)in_stack_ffffffffffffff78,
                                  (sexp)in_stack_ffffffffffffff70,uVar2,offset);
    }
    else {
      local_68._8_8_ = local_68 + 0x18;
      local_68._16_8_ = *(undefined8 *)(in_RDI + 0x6080);
      *(undefined1 **)(in_RDI + 0x6080) = local_68 + 8;
      local_78[0] = local_68;
      local_78[1] = *(undefined8 *)(in_RDI + 0x6080);
      *(undefined8 **)(in_RDI + 0x6080) = local_78;
      *(undefined1 **)(in_RDI + 0x6080) = &stack0xffffffffffffff70;
      local_a8 = &stack0xffffffffffffff68;
      *(undefined8 **)(in_RDI + 0x6080) = &stack0xffffffffffffff58;
      uVar2 = &stack0xffffffffffffff50;
      uVar3 = *(undefined8 *)(in_RDI + 0x6080);
      *(undefined1 **)(in_RDI + 0x6080) = &stack0xffffffffffffff40;
      dst_00 = (sexp)&stack0xffffffffffffff38;
      ctx_00 = *(sexp *)(in_RDI + 0x6080);
      *(undefined1 **)(in_RDI + 0x6080) = &stack0xffffffffffffff28;
      local_f0 = &stack0xffffffffffffff20;
      b_01 = *(sexp *)(in_RDI + 0x6080);
      *(undefined1 ***)(in_RDI + 0x6080) = &local_f0;
      local_68._40_8_ = (ulong)local_68._48_8_ >> 1;
      sexp_bignum_split((sexp)ctx_01,(sexp)uVar3,uVar2,lo,(sexp_conflict *)ctx_00);
      sexp_bignum_split((sexp)ctx_01,(sexp)uVar3,uVar2,lo,(sexp_conflict *)ctx_00);
      sexp_bignum_add(ctx_00,dst_00,psVar1,b_01);
      sexp_bignum_add(ctx_00,dst_00,psVar1,b_01);
      sexp_bignum_mul((sexp)in_RSI,(sexp)in_RDX,(sexp)in_RCX,(sexp)b_00);
      sexp_bignum_mul((sexp)in_RSI,(sexp)in_RDX,(sexp)in_RCX,(sexp)b_00);
      psVar1 = sexp_bignum_mul((sexp)in_RSI,(sexp)in_RDX,(sexp)in_RCX,(sexp)b_00);
      sexp_bignum_sub(ctx_00,dst_00,psVar1,b_01);
      sexp_bignum_sub(ctx_00,dst_00,psVar1,b_01);
      psVar1 = sexp_bignum_shift(ctx_00,dst_00,(sexp_uint_t)psVar1);
      sexp_bignum_shift(ctx_00,dst_00,(sexp_uint_t)psVar1);
      sexp_bignum_add(ctx_00,dst_00,psVar1,b_01);
      local_8 = sexp_bignum_add(ctx_00,dst_00,psVar1,b_01);
      *(undefined8 *)(in_RDI + 0x6080) = local_68._16_8_;
    }
    (((sexp)local_8)->value).flonum_bits[0] =
         ((anon_union_24768_35_b8e82fc1_for_value *)(in_RDX + 8))->flonum_bits[0] *
         ((anon_union_24768_35_b8e82fc1_for_value *)&((sexp_mark_stack_ptr_t *)in_RCX)->end)->
         flonum_bits[0];
  }
  return (sexp)local_8;
}

Assistant:

sexp sexp_bignum_mul (sexp ctx, sexp dst, sexp a, sexp b) {
  sexp_uint_t alen=sexp_bignum_hi(a), blen=sexp_bignum_hi(b), k,
    *bdata=sexp_bignum_data(b);
  sexp_gc_var7(a0, a1, b0, b1, z0, z1, z2);
  if (alen < blen) return sexp_bignum_mul(ctx, dst, b, a);
  if (blen == 1) {
    z1 = sexp_bignum_fxmul(ctx, dst, a, bdata[0], 0);
  } else {
    /* karatsuba:                             */
    /*   ab = (a1B^k + a0) * (b1B^k + b0)     */
    /*      = z2B^2k + z1B^k + z0             */
    /* where:                                 */
    /*   z2 = a1b1                            */
    /*   z1 = a1b0 + a0b1                     */
    /*   z0 = a0b0                            */
    /* then optimize further:                 */
    /*   z1 = (a1 + a0)(b1 + b0) - z2 - z0    */
    sexp_gc_preserve7(ctx, a0, a1, b0, b1, z0, z1, z2);
    k = blen / 2;
    sexp_bignum_split(ctx, a, k, &a0, &a1);
    sexp_bignum_split(ctx, b, k, &b0, &b1);
    z0 = sexp_bignum_add(ctx, NULL, a1, a0);  /* temp */
    z1 = sexp_bignum_add(ctx, NULL, b1, b0);
    z1 = sexp_bignum_mul(ctx, NULL, z1, z0);  /* 1 */
    z0 = sexp_bignum_mul(ctx, NULL, a0, b0);  /* 2 */
    z2 = sexp_bignum_mul(ctx, NULL, a1, b1);  /* 3 */
    z1 = sexp_bignum_sub(ctx, NULL, z1, z0);
    z1 = sexp_bignum_sub(ctx, NULL, z1, z2);
    z2 = sexp_bignum_shift(ctx, z2, 2*k);
    z1 = sexp_bignum_shift(ctx, z1, k);
    z1 = sexp_bignum_add(ctx, z1, z1, z0);
    z1 = sexp_bignum_add(ctx, z1, z1, z2);
    sexp_gc_release7(ctx);
  }
  sexp_bignum_sign(z1) = sexp_bignum_sign(a) * sexp_bignum_sign(b);
  return z1;
}